

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

bool __thiscall
ASDCP::MXF::SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Unarchive
          (SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this,MemIOReader *Reader)

{
  ui32_t uVar1;
  byte local_51;
  undefined1 local_38 [8];
  PartitionPair Tmp;
  bool result;
  MemIOReader *Reader_local;
  SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this_local;
  
  Tmp.ByteOffset._7_1_ = 1;
  while( true ) {
    uVar1 = Kumu::MemIOReader::Remainder(Reader);
    local_51 = 0;
    if (uVar1 != 0) {
      local_51 = Tmp.ByteOffset._7_1_;
    }
    if ((local_51 & 1) == 0) break;
    RIP::PartitionPair::PartitionPair((PartitionPair *)local_38);
    Tmp.ByteOffset._7_1_ = RIP::PartitionPair::Unarchive((PartitionPair *)local_38,Reader);
    if ((bool)Tmp.ByteOffset._7_1_) {
      std::__cxx11::
      list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::
      push_back(&this->
                 super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                ,(value_type *)local_38);
    }
    RIP::PartitionPair::~PartitionPair((PartitionPair *)local_38);
  }
  return (bool)(Tmp.ByteOffset._7_1_ & 1);
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader)
	    {
	      bool result = true;

	      while ( Reader->Remainder() > 0 && result )
		{
		  T Tmp;
		  result = Tmp.Unarchive(Reader);

		  if ( result )
		    {
		      this->push_back(Tmp);
		    }
		}

	      return result;
	    }